

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_build_canonical_arrays(uint64_t *cw_lens,uint64_t max_cw_length)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  ulong *puVar4;
  ulong uVar5;
  uint64_t *puVar6;
  uint64_t *puVar7;
  long lVar8;
  long lVar9;
  
  shuff_offset[0] = 0;
  puVar2 = cw_lens + max_cw_length;
  puVar1 = shuff_offset;
  uVar3 = 0;
  puVar6 = cw_lens + 1;
  for (puVar7 = puVar6; puVar1 = puVar1 + 1, puVar7 < puVar2; puVar7 = puVar7 + 1) {
    uVar3 = uVar3 + *puVar7;
    *puVar1 = uVar3;
  }
  *(undefined8 *)(&DAT_00159518 + max_cw_length * 8) = 0;
  for (puVar4 = (ulong *)(&std::__ioinit + max_cw_length * 8); (ulong *)0x15951f < puVar4;
      puVar4 = puVar4 + -1) {
    uVar3 = *puVar2;
    puVar2 = puVar2 + -1;
    *puVar4 = uVar3 + puVar4[1] >> 1;
  }
  uVar5 = 0x3f;
  for (lVar8 = 0; (uint64_t *)((long)shuff_lj_base + lVar8) < shuff_lj_base + max_cw_length;
      lVar8 = lVar8 + 8) {
    if (*(long *)((long)puVar6 + lVar8) == 0) {
      lVar9 = *(long *)(&DAT_00159718 + lVar8);
    }
    else {
      lVar9 = *(long *)((long)shuff_min_code + lVar8) << (uVar5 & 0x3f);
    }
    *(long *)((long)shuff_lj_base + lVar8) = lVar9;
    uVar5 = uVar5 - 1;
  }
  for (lVar8 = 0; *(long *)((long)puVar6 + lVar8) == 0; lVar8 = lVar8 + 8) {
    *(undefined8 *)((long)shuff_lj_base + lVar8) = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void shuff_build_canonical_arrays(uint64_t* cw_lens, uint64_t max_cw_length)
{
    uint64_t* q;
    uint64_t* p;

    // build offset
    q = shuff_offset;
    *q = 0;
    for (p = cw_lens + 1; p < cw_lens + max_cw_length; p++, q++)
        *(q + 1) = *q + *p;

    // generate the min_code array
    // min_code[i] = (min_code[i+1] + cw_lens[i+2]) >>1
    q = shuff_min_code + max_cw_length - 1;
    *q = 0;
    for (q--, p = cw_lens + max_cw_length; q >= shuff_min_code; q--, p--)
        *q = (*(q + 1) + *p) >> 1;

    // generate the lj_base array
    q = shuff_lj_base;
    uint64_t* pp = shuff_min_code;
    int64_t left_shift = (sizeof(uint64_t) << 3) - 1;
    for (p = cw_lens + 1; q < shuff_lj_base + max_cw_length;
         p++, q++, pp++, left_shift--)
        if (*p == 0)
            *q = *(q - 1);
        else
            *q = (*pp) << left_shift;
    for (p = cw_lens + 1, q = shuff_lj_base; *p == 0; p++, q++)
        *q = SHUFF_MAX_ULONG;
}